

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseProtoKey(Parser *this)

{
  CheckedError *ce;
  long in_RSI;
  
  if (*(int *)(in_RSI + 0x1c) == 0x28) {
    do {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011765a;
      CheckedError::~CheckedError((CheckedError *)this);
    } while ((*(int *)(in_RSI + 0x1c) == 0x104) || (*(int *)(in_RSI + 0x1c) == 0x2e));
    while( true ) {
      Expect(this,(int)in_RSI);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
      CheckedError::~CheckedError((CheckedError *)this);
      if (*(int *)(in_RSI + 0x1c) != 0x2e) goto LAB_00117656;
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
      CheckedError::~CheckedError((CheckedError *)this);
    }
  }
  else {
    Expect(this,(int)in_RSI);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
LAB_00117656:
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
  }
LAB_0011765a:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoKey() {
  if (token_ == '(') {
    NEXT();
    // Skip "(a.b)" style custom attributes.
    while (token_ == '.' || token_ == kTokenIdentifier) NEXT();
    EXPECT(')');
    while (Is('.')) {
      NEXT();
      EXPECT(kTokenIdentifier);
    }
  } else {
    EXPECT(kTokenIdentifier);
  }
  return NoError();
}